

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shellquote_shared.h
# Opt level: O2

QString * shellQuote(QString *__return_storage_ptr__,QString *arg)

{
  QLatin1StringView latin1;
  bool bVar1;
  QString *ret;
  long in_FS_OFFSET;
  QLatin1String QVar2;
  QLatin1String local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((arg->d).size == 0) {
    QLatin1String::QLatin1String(&local_30,"\"\"");
    latin1.m_data = local_30.m_data;
    latin1.m_size = local_30.m_size;
    QString::QString(__return_storage_ptr__,latin1);
  }
  else {
    (__return_storage_ptr__->d).size = -0x5555555555555556;
    (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&arg->d);
    bVar1 = hasSpecialChars(__return_storage_ptr__,
                            (uchar (*) [16])shellQuoteUnix(QString_const&)::iqm);
    if (bVar1) {
      QLatin1String::QLatin1String(&local_30,"\'\\\'\'");
      QVar2.m_data = (char *)local_30.m_size;
      QVar2.m_size = 0x27;
      QString::replace((QChar)(char16_t)__return_storage_ptr__,QVar2,
                       (CaseSensitivity)local_30.m_data);
      QString::prepend(__return_storage_ptr__,(QChar)0x27);
      QString::append((QChar)(char16_t)__return_storage_ptr__);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString shellQuote(const QString &arg)
{
    if (QDir::separator() == QLatin1Char('\\'))
        return shellQuoteWin(arg);
    else
        return shellQuoteUnix(arg);
}